

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression *
soul::ExpressionHelpers::createStruct(Expression *__return_storage_ptr__,string *s,string *uid)

{
  undefined1 local_58 [40];
  string local_30 [32];
  
  local_58._0_4_ = structure;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)s);
  std::__cxx11::string::string(local_30,(string *)uid);
  fromSection(__return_storage_ptr__,(Section *)local_58);
  SourceCodeModel::Expression::Section::~Section((Section *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createStruct (std::string s, std::string uid)
    {
        return fromSection ({ SourceCodeModel::Expression::Section::Type::structure, std::move (s), std::move (uid) });
    }